

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::Start
          (MeshEdgebreakerTraversalDecoder *this,DecoderBuffer *out_buffer)

{
  char *pcVar1;
  int64_t iVar2;
  int64_t iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  undefined1 uVar6;
  uint16_t uVar7;
  bool bVar8;
  
  bVar8 = DecodeTraversalSymbols(this);
  if (((bVar8) && (bVar8 = DecodeStartFaces(this), bVar8)) &&
     (bVar8 = DecodeAttributeSeams(this), bVar8)) {
    uVar6 = (this->buffer_).field_0x31;
    uVar7 = (this->buffer_).bitstream_version_;
    out_buffer->bit_mode_ = (this->buffer_).bit_mode_;
    out_buffer->field_0x31 = uVar6;
    out_buffer->bitstream_version_ = uVar7;
    pcVar1 = (this->buffer_).data_;
    iVar2 = (this->buffer_).data_size_;
    iVar3 = (this->buffer_).pos_;
    puVar4 = (this->buffer_).bit_decoder_.bit_buffer_;
    sVar5 = (this->buffer_).bit_decoder_.bit_offset_;
    (out_buffer->bit_decoder_).bit_buffer_end_ = (this->buffer_).bit_decoder_.bit_buffer_end_;
    (out_buffer->bit_decoder_).bit_offset_ = sVar5;
    out_buffer->pos_ = iVar3;
    (out_buffer->bit_decoder_).bit_buffer_ = puVar4;
    out_buffer->data_ = pcVar1;
    out_buffer->data_size_ = iVar2;
    return true;
  }
  return false;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
    // Decode symbols from the main buffer decoder and face configurations from
    // the start_face_buffer decoder.
    if (!DecodeTraversalSymbols()) {
      return false;
    }

    if (!DecodeStartFaces()) {
      return false;
    }

    if (!DecodeAttributeSeams()) {
      return false;
    }
    *out_buffer = buffer_;
    return true;
  }